

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

bool __thiscall
upb::generator::anon_unknown_2::CGenerator::Generate
          (CGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  initializer_list<const_google::protobuf::FileDescriptor_*> __l;
  int iVar1;
  allocator<const_google::protobuf::FileDescriptor_*> local_61;
  FileDescriptor *local_60;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  files;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  CGenerator *this_local;
  
  local_58 = &local_60;
  local_50 = 1;
  local_60 = file;
  files.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)error;
  std::allocator<const_google::protobuf::FileDescriptor_*>::allocator(&local_61);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *)local_48,__l,&local_61);
  std::allocator<const_google::protobuf::FileDescriptor_*>::~allocator(&local_61);
  iVar1 = (*(this->super_CodeGenerator)._vptr_CodeGenerator[3])
                    (this,local_48,parameter,generator_context,
                     files.
                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             *)local_48);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool Generate(const google::protobuf::FileDescriptor* file,
                const std::string& parameter,
                google::protobuf::compiler::GeneratorContext* generator_context,
                std::string* error) const override {
    std::vector<const google::protobuf::FileDescriptor*> files{file};
    return GenerateAll(files, parameter, generator_context, error);
  }